

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_scalar_property
              (p_ply ply,p_ply_element element,p_ply_property_conflict property,
              p_ply_argument argument)

{
  code *pcVar1;
  p_ply_ihandler p_Var2;
  int iVar3;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  p_ply in_RDI;
  p_ply_ihandler handler;
  p_ply_ihandler *driver;
  p_ply_read_cb read_cb;
  int local_4;
  
  pcVar1 = *(code **)(in_RDX + 0x110);
  p_Var2 = in_RDI->idriver->ihandler[*(uint *)(in_RDX + 0x100)];
  *(undefined8 *)(in_RCX + 0x18) = 1;
  *(undefined8 *)(in_RCX + 0x20) = 0;
  iVar3 = (*p_Var2)(in_RDI,(double *)(in_RCX + 0x28));
  if (iVar3 == 0) {
    ply_ferror(in_RDI,"Error reading \'%s\' of \'%s\' number %d",in_RDX,in_RSI,
               *(undefined8 *)(in_RCX + 8));
    local_4 = 0;
  }
  else {
    if ((pcVar1 != (code *)0x0) && (iVar3 = (*pcVar1)(in_RCX), iVar3 == 0)) {
      ply_ferror(in_RDI,"Aborted by user");
      return 0;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ply_read_scalar_property(p_ply ply, p_ply_element element,
                                    p_ply_property property,
                                    p_ply_argument argument) {
    p_ply_read_cb read_cb = property->read_cb;
    p_ply_ihandler *driver = ply->idriver->ihandler;
    p_ply_ihandler handler = driver[property->type];
    argument->length = 1;
    argument->value_index = 0;
    if (!handler(ply, &argument->value)) {
        ply_ferror(ply, "Error reading '%s' of '%s' number %d", property->name,
                   element->name, argument->instance_index);
        return 0;
    }
    if (read_cb && !read_cb(argument)) {
        ply_ferror(ply, "Aborted by user");
        return 0;
    }
    return 1;
}